

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

array * __thiscall mpt::array::operator=(array *this,array *a)

{
  content *pcVar1;
  long lVar2;
  content *pcVar3;
  
  pcVar3 = (a->_buf)._ref;
  if (pcVar3 != (this->_buf)._ref) {
    if (pcVar3 == (content *)0x0) {
      pcVar3 = (content *)0x0;
    }
    else {
      lVar2 = (**(code **)(*(long *)pcVar3 + 0x10))(pcVar3);
      if (lVar2 == 0) {
        pcVar3 = (content *)0x0;
      }
    }
    pcVar1 = (this->_buf)._ref;
    if (pcVar1 != (content *)0x0) {
      (**(code **)(*(long *)pcVar1 + 8))();
    }
    (this->_buf)._ref = pcVar3;
  }
  return this;
}

Assistant:

array &array::operator= (const array &a)
{
	_buf = a._buf;
	return *this;
}